

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O3

int Acb_NtkFindSupp3(Acb_Ntk_t *p,int Pivot,sat_solver *pSat,int nVars,int nDivs,Vec_Int_t *vWin,
                    Vec_Int_t *vSupp,int nLutSize,int fDelay)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  size_t sVar20;
  char *__assertion;
  ulong uVar21;
  long lVar22;
  long lVar23;
  
  if (fDelay != 0) {
    return 0;
  }
  if (Pivot < 1) {
    __assert_fail("i>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                  ,0xfe,"int Acb_ObjFanOffset(Acb_Ntk_t *, int)");
  }
  iVar12 = (p->vObjFans).nSize;
  if (Pivot < iVar12) {
    iVar18 = (p->vObjFans).pArray[(uint)Pivot];
    lVar22 = (long)iVar18;
    if ((-1 < lVar22) && (iVar18 < (p->vFanSto).nSize)) {
      piVar6 = (p->vFanSto).pArray;
      iVar18 = piVar6[lVar22];
      if (0 < iVar18) {
        piVar6 = piVar6 + lVar22;
        iVar12 = nVars * 6 + nDivs;
        lVar22 = 0;
        do {
          uVar1 = piVar6[lVar22 + 1];
          lVar16 = (long)(int)uVar1;
          if (lVar16 < 1) goto LAB_0037e04a;
          if ((p->vObjType).nSize <= (int)uVar1) goto LAB_0037e02b;
          if ((p->vObjType).pArray[lVar16] != '\x03') {
            if ((p->vFanouts).nSize <= (int)uVar1) goto LAB_0037e069;
            if ((p->vFanouts).pArray[lVar16].nSize == 1) {
              if ((p->vObjFans).nSize <= Pivot) goto LAB_0037df0b;
              iVar19 = (p->vObjFans).pArray[(uint)Pivot];
              lVar10 = (long)iVar19;
              if ((lVar10 < 0) || ((p->vFanSto).nSize <= iVar19)) goto LAB_0037dfed;
              piVar7 = (p->vFanSto).pArray;
              if (0 < piVar7[lVar10]) {
                piVar7 = piVar7 + lVar10;
                lVar10 = 0;
                do {
                  uVar2 = piVar7[lVar10 + 1];
                  lVar15 = (long)(int)uVar2;
                  if (lVar15 < 1) goto LAB_0037e04a;
                  if ((p->vObjType).nSize <= (int)uVar2) goto LAB_0037e02b;
                  if ((p->vObjType).pArray[lVar15] != '\x03') {
                    if ((p->vFanouts).nSize <= (int)uVar2) goto LAB_0037e069;
                    if ((lVar10 != lVar22) && ((p->vFanouts).pArray[lVar15].nSize == 1)) {
                      if (uVar1 == uVar2) {
                        __assert_fail("iFanin != iFanin2",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                                      ,0x400,
                                      "int Acb_NtkFindSupp3(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                                     );
                      }
                      vSupp->nSize = 0;
                      iVar18 = (p->vObjFans).nSize;
                      if (iVar18 <= Pivot) goto LAB_0037df0b;
                      iVar19 = (p->vObjFans).pArray[(uint)Pivot];
                      lVar17 = (long)iVar19;
                      if ((lVar17 < 0) || ((p->vFanSto).nSize <= iVar19)) goto LAB_0037dfed;
                      piVar8 = (p->vFanSto).pArray;
                      iVar19 = piVar8[lVar17];
                      if (0 < iVar19) {
                        lVar23 = 0;
                        do {
                          uVar3 = piVar8[lVar17 + lVar23 + 1];
                          if ((uVar3 != uVar1) && (uVar3 != uVar2)) {
                            if ((int)uVar3 < 1) goto LAB_0037df52;
                            uVar4 = (p->vObjFunc).nSize;
                            if ((int)uVar4 < 1) goto LAB_0037df2a;
                            if (uVar4 <= uVar3) goto LAB_0037df0b;
                            iVar18 = (p->vObjFunc).pArray[uVar3];
                            if (iVar18 < 0) {
                              __assert_fail("Acb_ObjFunc(p, iFanin3) >= 0",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                                            ,0x407,
                                            "int Acb_NtkFindSupp3(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                                           );
                            }
                            iVar18 = iVar18 + nVars * 6;
                            if (iVar18 < 0) goto LAB_0037df33;
                            Vec_IntPush(vSupp,iVar18 * 2);
                            iVar19 = piVar8[lVar17];
                          }
                          lVar23 = lVar23 + 1;
                        } while (lVar23 < iVar19);
                        iVar18 = (p->vObjFans).nSize;
                      }
                      if (iVar18 <= (int)uVar1) goto LAB_0037df0b;
                      iVar19 = (p->vObjFans).pArray[lVar16];
                      lVar17 = (long)iVar19;
                      if ((lVar17 < 0) || ((p->vFanSto).nSize <= iVar19)) goto LAB_0037dfed;
                      piVar8 = (p->vFanSto).pArray;
                      if (0 < piVar8[lVar17]) {
                        lVar23 = 0;
                        do {
                          uVar3 = piVar8[lVar17 + lVar23 + 1];
                          if ((long)(int)uVar3 < 1) goto LAB_0037df52;
                          uVar4 = (p->vObjFunc).nSize;
                          if ((int)uVar4 < 1) goto LAB_0037df2a;
                          if (uVar4 <= uVar3) goto LAB_0037df0b;
                          iVar18 = (p->vObjFunc).pArray[(int)uVar3];
                          if (iVar18 < 0) {
                            __assert_fail("Acb_ObjFunc(p, iFanin3) >= 0",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                                          ,0x40f,
                                          "int Acb_NtkFindSupp3(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                                         );
                          }
                          iVar18 = iVar18 + iVar12;
                          if (iVar18 < 0) goto LAB_0037df33;
                          lVar23 = lVar23 + 1;
                          Vec_IntPush(vSupp,iVar18 * 2);
                        } while (lVar23 < piVar8[lVar17]);
                        iVar18 = (p->vObjFans).nSize;
                      }
                      if (iVar18 <= (int)uVar2) goto LAB_0037df0b;
                      iVar18 = (p->vObjFans).pArray[lVar15];
                      lVar15 = (long)iVar18;
                      if ((lVar15 < 0) || ((p->vFanSto).nSize <= iVar18)) goto LAB_0037dfed;
                      piVar8 = (p->vFanSto).pArray;
                      iVar18 = piVar8[lVar15];
                      if (0 < iVar18) {
                        piVar8 = piVar8 + lVar15;
                        lVar15 = 0;
                        do {
                          uVar2 = piVar8[lVar15 + 1];
                          if ((long)(int)uVar2 < 1) goto LAB_0037df52;
                          uVar3 = (p->vObjFunc).nSize;
                          if ((int)uVar3 < 1) goto LAB_0037df2a;
                          if (uVar3 <= uVar2) goto LAB_0037df0b;
                          iVar19 = (p->vObjFunc).pArray[(int)uVar2];
                          if (iVar19 < 0) {
                            __assert_fail("Acb_ObjFunc(p, iFanin3) >= 0",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                                          ,0x415,
                                          "int Acb_NtkFindSupp3(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                                         );
                          }
                          iVar19 = iVar19 + iVar12;
                          if (iVar19 < 0) goto LAB_0037df33;
                          iVar19 = iVar19 * 2;
                          if (0 < (long)vSupp->nSize) {
                            lVar17 = 0;
                            do {
                              if (vSupp->pArray[lVar17] == iVar19) goto LAB_0037d830;
                              lVar17 = lVar17 + 1;
                            } while (vSupp->nSize != lVar17);
                          }
                          Vec_IntPush(vSupp,iVar19);
                          iVar18 = *piVar8;
LAB_0037d830:
                          lVar15 = lVar15 + 1;
                        } while (lVar15 < iVar18);
                      }
                      uVar9 = (ulong)vSupp->nSize;
                      if (0 < (long)uVar9) {
                        uVar11 = 1;
                        uVar14 = 0;
                        do {
                          uVar13 = uVar14 + 1;
                          if (uVar13 < uVar9) {
                            uVar21 = uVar11;
                            do {
                              if (vSupp->pArray[uVar14] == vSupp->pArray[uVar21]) {
                                __assert_fail("Vec_IntCheckUniqueSmall(vSupp)",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                                              ,0x418,
                                              "int Acb_NtkFindSupp3(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                                             );
                              }
                              uVar21 = uVar21 + 1;
                            } while (uVar9 != uVar21);
                          }
                          uVar11 = uVar11 + 1;
                          uVar14 = uVar13;
                        } while (uVar13 != uVar9);
                      }
                      iVar18 = sat_solver_solve(pSat,vSupp->pArray,vSupp->pArray + uVar9,0,0,0,0);
                      if (iVar18 == -1) {
                        iVar18 = sat_solver_minimize_assumptions(pSat,vSupp->pArray,vSupp->nSize,0);
                        if (vSupp->nSize < iVar18) goto LAB_0037e088;
                        vSupp->nSize = iVar18;
                        piVar8 = vSupp->pArray;
                        if (iVar18 < 1) {
                          sVar20 = (size_t)iVar18;
                        }
                        else {
                          lVar15 = 0;
                          do {
                            if (piVar8[lVar15] < 0) goto LAB_0037df71;
                            piVar8[lVar15] = ((uint)piVar8[lVar15] >> 1) + nVars * -6;
                            lVar15 = lVar15 + 1;
                            sVar20 = (size_t)vSupp->nSize;
                          } while (lVar15 < (long)sVar20);
                        }
                        qsort(piVar8,sVar20,4,Vec_IntSortCompare2);
                        iVar18 = vSupp->nSize;
                        if (0 < iVar18) {
                          piVar8 = vSupp->pArray;
                          lVar15 = 0;
                          iVar19 = 0;
                          do {
                            iVar5 = piVar8[lVar15];
                            if (iVar5 < nDivs) {
                              iVar19 = iVar19 + 1;
                            }
                            else {
                              piVar8[lVar15] = iVar5 - nDivs;
                              iVar18 = vSupp->nSize;
                            }
                            lVar15 = lVar15 + 1;
                          } while (lVar15 < iVar18);
                          if (iVar19 != 0) {
                            if (iVar19 < 1) {
                              __assert_fail("NodeMark > 0",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                                            ,0x431,
                                            "int Acb_NtkFindSupp3(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                                           );
                            }
                            if (iVar18 - iVar19 <= nLutSize) {
                              return iVar19;
                            }
                          }
                        }
                      }
                    }
                  }
                  lVar10 = lVar10 + 1;
                } while (lVar10 < *piVar7);
                iVar18 = *piVar6;
              }
            }
          }
          lVar22 = lVar22 + 1;
        } while (lVar22 < iVar18);
        iVar12 = (p->vObjFans).nSize;
      }
      if (iVar12 <= Pivot) goto LAB_0037df0b;
      iVar12 = (p->vObjFans).pArray[(uint)Pivot];
      lVar22 = (long)iVar12;
      if ((-1 < lVar22) && (iVar12 < (p->vFanSto).nSize)) {
        piVar6 = (p->vFanSto).pArray;
        iVar12 = piVar6[lVar22];
        if (iVar12 < 1) {
          return 0;
        }
        piVar6 = piVar6 + lVar22;
        iVar18 = nVars * 6 + nDivs;
        lVar22 = 0;
        do {
          uVar1 = piVar6[lVar22 + 1];
          lVar16 = (long)(int)uVar1;
          if (lVar16 < 1) {
LAB_0037e04a:
            __assert_fail("i>0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                          ,0xee,"Acb_ObjType_t Acb_ObjType(Acb_Ntk_t *, int)");
          }
          if ((p->vObjType).nSize <= (int)uVar1) {
LAB_0037e02b:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                          ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
          }
          if ((p->vObjType).pArray[lVar16] != '\x03') {
            if ((p->vFanouts).nSize <= (int)uVar1) {
LAB_0037e069:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWec.h"
                            ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
            }
            if ((p->vFanouts).pArray[lVar16].nSize == 1) {
              if ((p->vObjFans).nSize <= (int)uVar1) goto LAB_0037df0b;
              iVar19 = (p->vObjFans).pArray[lVar16];
              lVar10 = (long)iVar19;
              if ((lVar10 < 0) || ((p->vFanSto).nSize <= iVar19)) break;
              piVar7 = (p->vFanSto).pArray;
              if (0 < piVar7[lVar10]) {
                piVar7 = piVar7 + lVar10;
                lVar10 = 0;
                do {
                  uVar2 = piVar7[lVar10 + 1];
                  lVar15 = (long)(int)uVar2;
                  if (lVar15 < 1) goto LAB_0037e04a;
                  if ((p->vObjType).nSize <= (int)uVar2) goto LAB_0037e02b;
                  if ((p->vObjType).pArray[lVar15] != '\x03') {
                    if ((p->vFanouts).nSize <= (int)uVar2) goto LAB_0037e069;
                    if ((p->vFanouts).pArray[lVar15].nSize == 1) {
                      if (uVar1 == uVar2) {
                        __assert_fail("iFanin != iFanin2",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                                      ,0x441,
                                      "int Acb_NtkFindSupp3(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                                     );
                      }
                      vSupp->nSize = 0;
                      iVar12 = (p->vObjFans).nSize;
                      if (iVar12 <= Pivot) goto LAB_0037df0b;
                      iVar19 = (p->vObjFans).pArray[(uint)Pivot];
                      lVar17 = (long)iVar19;
                      if ((lVar17 < 0) || ((p->vFanSto).nSize <= iVar19)) goto LAB_0037dfed;
                      piVar8 = (p->vFanSto).pArray;
                      iVar19 = piVar8[lVar17];
                      if (0 < iVar19) {
                        lVar23 = 0;
                        do {
                          uVar3 = piVar8[lVar17 + lVar23 + 1];
                          if ((uVar3 != uVar1) && (uVar3 != uVar2)) {
                            if ((int)uVar3 < 1) goto LAB_0037df52;
                            uVar4 = (p->vObjFunc).nSize;
                            if ((int)uVar4 < 1) goto LAB_0037df2a;
                            if (uVar4 <= uVar3) goto LAB_0037df0b;
                            iVar12 = (p->vObjFunc).pArray[uVar3] + nVars * 6;
                            if (iVar12 < 0) goto LAB_0037df33;
                            Vec_IntPush(vSupp,iVar12 * 2);
                            iVar19 = piVar8[lVar17];
                          }
                          lVar23 = lVar23 + 1;
                        } while (lVar23 < iVar19);
                        iVar12 = (p->vObjFans).nSize;
                      }
                      if (iVar12 <= (int)uVar1) goto LAB_0037df0b;
                      iVar19 = (p->vObjFans).pArray[lVar16];
                      lVar17 = (long)iVar19;
                      if ((lVar17 < 0) || ((p->vFanSto).nSize <= iVar19)) goto LAB_0037dfed;
                      piVar8 = (p->vFanSto).pArray;
                      iVar19 = piVar8[lVar17];
                      if (0 < iVar19) {
                        lVar23 = 0;
                        do {
                          uVar3 = piVar8[lVar17 + lVar23 + 1];
                          if (uVar3 != uVar2) {
                            if ((int)uVar3 < 1) goto LAB_0037df52;
                            uVar4 = (p->vObjFunc).nSize;
                            if ((int)uVar4 < 1) goto LAB_0037df2a;
                            if (uVar4 <= uVar3) goto LAB_0037df0b;
                            iVar12 = (p->vObjFunc).pArray[uVar3] + iVar18;
                            if (iVar12 < 0) goto LAB_0037df33;
                            Vec_IntPush(vSupp,iVar12 * 2);
                            iVar19 = piVar8[lVar17];
                          }
                          lVar23 = lVar23 + 1;
                        } while (lVar23 < iVar19);
                        iVar12 = (p->vObjFans).nSize;
                      }
                      if (iVar12 <= (int)uVar2) goto LAB_0037df0b;
                      iVar12 = (p->vObjFans).pArray[lVar15];
                      lVar15 = (long)iVar12;
                      if ((lVar15 < 0) || ((p->vFanSto).nSize <= iVar12)) goto LAB_0037dfed;
                      piVar8 = (p->vFanSto).pArray;
                      iVar12 = piVar8[lVar15];
                      if (0 < iVar12) {
                        piVar8 = piVar8 + lVar15;
                        lVar15 = 0;
                        do {
                          uVar2 = piVar8[lVar15 + 1];
                          if ((long)(int)uVar2 < 1) goto LAB_0037df52;
                          uVar3 = (p->vObjFunc).nSize;
                          if ((int)uVar3 < 1) goto LAB_0037df2a;
                          if (uVar3 <= uVar2) goto LAB_0037df0b;
                          iVar19 = (p->vObjFunc).pArray[(int)uVar2];
                          if (iVar19 < 0) {
                            __assert_fail("Acb_ObjFunc(p, iFanin3) >= 0",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                                          ,0x451,
                                          "int Acb_NtkFindSupp3(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                                         );
                          }
                          iVar19 = iVar19 + iVar18;
                          if (iVar19 < 0) {
LAB_0037df33:
                            __assert_fail("Var >= 0 && !(c >> 1)",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                                          ,0x12e,"int Abc_Var2Lit(int, int)");
                          }
                          iVar19 = iVar19 * 2;
                          if (0 < (long)vSupp->nSize) {
                            lVar17 = 0;
                            do {
                              if (vSupp->pArray[lVar17] == iVar19) goto LAB_0037dd67;
                              lVar17 = lVar17 + 1;
                            } while (vSupp->nSize != lVar17);
                          }
                          Vec_IntPush(vSupp,iVar19);
                          iVar12 = *piVar8;
LAB_0037dd67:
                          lVar15 = lVar15 + 1;
                        } while (lVar15 < iVar12);
                      }
                      uVar9 = (ulong)vSupp->nSize;
                      if (0 < (long)uVar9) {
                        uVar11 = 1;
                        uVar14 = 0;
                        do {
                          uVar13 = uVar14 + 1;
                          if (uVar13 < uVar9) {
                            uVar21 = uVar11;
                            do {
                              if (vSupp->pArray[uVar14] == vSupp->pArray[uVar21]) {
                                __assert_fail("Vec_IntCheckUniqueSmall(vSupp)",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                                              ,0x454,
                                              "int Acb_NtkFindSupp3(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                                             );
                              }
                              uVar21 = uVar21 + 1;
                            } while (uVar9 != uVar21);
                          }
                          uVar11 = uVar11 + 1;
                          uVar14 = uVar13;
                        } while (uVar13 != uVar9);
                      }
                      iVar12 = sat_solver_solve(pSat,vSupp->pArray,vSupp->pArray + uVar9,0,0,0,0);
                      if (iVar12 != -1) {
                        printf("Failed internal check at node %d.\n",(ulong)(uint)Pivot);
                        __assert_fail("status == l_False",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                                      ,0x45d,
                                      "int Acb_NtkFindSupp3(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                                     );
                      }
                      iVar12 = sat_solver_minimize_assumptions(pSat,vSupp->pArray,vSupp->nSize,0);
                      if (vSupp->nSize < iVar12) {
LAB_0037e088:
                        __assert_fail("p->nSize >= nSizeNew",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                                      ,0x2b5,"void Vec_IntShrink(Vec_Int_t *, int)");
                      }
                      vSupp->nSize = iVar12;
                      piVar8 = vSupp->pArray;
                      if (iVar12 < 1) {
                        sVar20 = (size_t)iVar12;
                      }
                      else {
                        lVar15 = 0;
                        do {
                          if (piVar8[lVar15] < 0) {
LAB_0037df71:
                            __assert_fail("Lit >= 0",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                                          ,0x12f,"int Abc_Lit2Var(int)");
                          }
                          piVar8[lVar15] = ((uint)piVar8[lVar15] >> 1) + nVars * -6;
                          lVar15 = lVar15 + 1;
                          sVar20 = (size_t)vSupp->nSize;
                        } while (lVar15 < (long)sVar20);
                      }
                      qsort(piVar8,sVar20,4,Vec_IntSortCompare2);
                      iVar12 = vSupp->nSize;
                      if (0 < iVar12) {
                        piVar8 = vSupp->pArray;
                        lVar15 = 0;
                        iVar19 = 0;
                        do {
                          iVar5 = piVar8[lVar15];
                          if (iVar5 < nDivs) {
                            iVar19 = iVar19 + 1;
                          }
                          else {
                            piVar8[lVar15] = iVar5 - nDivs;
                            iVar12 = vSupp->nSize;
                          }
                          lVar15 = lVar15 + 1;
                        } while (lVar15 < iVar12);
                        if (iVar19 != 0) {
                          if (iVar19 < 1) {
                            __assert_fail("NodeMark > 0",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                                          ,0x46e,
                                          "int Acb_NtkFindSupp3(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                                         );
                          }
                          if (iVar12 - iVar19 <= nLutSize) {
                            return iVar19;
                          }
                        }
                      }
                    }
                  }
                  lVar10 = lVar10 + 1;
                } while (lVar10 < *piVar7);
                iVar12 = *piVar6;
              }
            }
          }
          lVar22 = lVar22 + 1;
          if (iVar12 <= lVar22) {
            return 0;
          }
        } while( true );
      }
    }
LAB_0037dfed:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
LAB_0037df0b:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
LAB_0037df52:
  __assertion = "i>0";
  goto LAB_0037df59;
LAB_0037df2a:
  __assertion = "Acb_NtkHasObjFuncs(p)";
LAB_0037df59:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                ,0x109,"int Acb_ObjFunc(Acb_Ntk_t *, int)");
}

Assistant:

int Acb_NtkFindSupp3( Acb_Ntk_t * p, int Pivot, sat_solver * pSat, int nVars, int nDivs, Vec_Int_t * vWin, Vec_Int_t * vSupp, int nLutSize, int fDelay )
{
    int nSuppNew, status, k, iFanin, * pFanins, k2, iFanin2, * pFanins2, k3, iFanin3, * pFanins3, NodeMark;

    if ( fDelay )
        return 0;

    // iterate through pairs of fanins with one fanouts
    Acb_ObjForEachFaninFast( p, Pivot, pFanins, iFanin, k )
    {
        if ( !Acb_ObjIsAreaCritical(p, iFanin) )
            continue;
        Acb_ObjForEachFaninFast( p, Pivot, pFanins2, iFanin2, k2 )
        {
            if ( !Acb_ObjIsAreaCritical(p, iFanin2) || k2 == k )
                continue;
            // iFanin and iFanin2 have 1 fanout
            assert( iFanin != iFanin2 );

            // collect fanins of the root node
            Vec_IntClear( vSupp );
            Acb_ObjForEachFaninFast( p, Pivot, pFanins3, iFanin3, k3 )
                if ( iFanin3 != iFanin && iFanin3 != iFanin2 )
                {
                    assert( Acb_ObjFunc(p, iFanin3) >= 0 );
                    Vec_IntPush( vSupp, Abc_Var2Lit(Acb_ObjFunc(p, iFanin3) + 6*nVars, 0) );
                }
            NodeMark = Vec_IntSize(vSupp);

            // collect fanins of the second node
            Acb_ObjForEachFaninFast( p, iFanin, pFanins3, iFanin3, k3 )
            {
                assert( Acb_ObjFunc(p, iFanin3) >= 0 );
                Vec_IntPush( vSupp, Abc_Var2Lit(Acb_ObjFunc(p, iFanin3) + 6*nVars + nDivs, 0) );
            }
            // collect fanins of the third node
            Acb_ObjForEachFaninFast( p, iFanin2, pFanins3, iFanin3, k3 )
            {
                assert( Acb_ObjFunc(p, iFanin3) >= 0 );
                Vec_IntPushUnique( vSupp, Abc_Var2Lit(Acb_ObjFunc(p, iFanin3) + 6*nVars + nDivs, 0) );
            }
            assert( Vec_IntCheckUniqueSmall(vSupp) );

            // sort fanins by level
            //Vec_IntSelectSortCost( Vec_IntArray(vSupp) + NodeMark, Vec_IntSize(vSupp) - NodeMark, &p->vLevelD );
            // solve for these fanins
            status = sat_solver_solve( pSat, Vec_IntArray(vSupp), Vec_IntLimit(vSupp), 0, 0, 0, 0 );
            if ( status != l_False )
                continue;
            assert( status == l_False );
            nSuppNew = sat_solver_minimize_assumptions( pSat, Vec_IntArray(vSupp), Vec_IntSize(vSupp), 0 );
            Vec_IntShrink( vSupp, nSuppNew );
            Vec_IntLits2Vars( vSupp, -6*nVars );
            Vec_IntSort( vSupp, 1 );
            // count how many belong to H; the rest belong to G
            NodeMark = 0;
            Vec_IntForEachEntry( vSupp, iFanin3, k3 )
                if ( iFanin3 >= nDivs )
                    Vec_IntWriteEntry( vSupp, k3, iFanin3 - nDivs );
                else 
                    NodeMark++;
            if ( NodeMark == 0 )
            {
                //printf( "Obj %d: Special case 1 (vars = %d)\n", Pivot, Vec_IntSize(vSupp) );
                continue;
            }
            assert( NodeMark > 0 );
            if ( Vec_IntSize(vSupp) - NodeMark <= nLutSize )
                return NodeMark;
        }
    }

    // iterate through fanins with one fanout and their fanins with one fanout
    Acb_ObjForEachFaninFast( p, Pivot, pFanins, iFanin, k )
    {
        if ( !Acb_ObjIsAreaCritical(p, iFanin) )
            continue;
        Acb_ObjForEachFaninFast( p, iFanin, pFanins2, iFanin2, k2 )
        {
            if ( !Acb_ObjIsAreaCritical(p, iFanin2) )
                continue;
            // iFanin and iFanin2 have 1 fanout
            assert( iFanin != iFanin2 );

            // collect fanins of the root node
            Vec_IntClear( vSupp );
            Acb_ObjForEachFaninFast( p, Pivot, pFanins3, iFanin3, k3 )
                if ( iFanin3 != iFanin && iFanin3 != iFanin2 )
                    Vec_IntPush( vSupp, Abc_Var2Lit(Acb_ObjFunc(p, iFanin3) + 6*nVars, 0) );
            NodeMark = Vec_IntSize(vSupp);

            // collect fanins of the second node
            Acb_ObjForEachFaninFast( p, iFanin, pFanins3, iFanin3, k3 )
                if ( iFanin3 != iFanin2 )
                    Vec_IntPush( vSupp, Abc_Var2Lit(Acb_ObjFunc(p, iFanin3) + 6*nVars + nDivs, 0) );
            // collect fanins of the third node
            Acb_ObjForEachFaninFast( p, iFanin2, pFanins3, iFanin3, k3 )
            {
                assert( Acb_ObjFunc(p, iFanin3) >= 0 );
                Vec_IntPushUnique( vSupp, Abc_Var2Lit(Acb_ObjFunc(p, iFanin3) + 6*nVars + nDivs, 0) );
            }
            assert( Vec_IntCheckUniqueSmall(vSupp) );

            // sort fanins by level
            //Vec_IntSelectSortCost( Vec_IntArray(vSupp) + NodeMark, Vec_IntSize(vSupp) - NodeMark, &p->vLevelD );
            //Sat_SolverWriteDimacs( pSat, NULL, Vec_IntArray(vSupp), Vec_IntLimit(vSupp), 0 );
            // solve for these fanins
            status = sat_solver_solve( pSat, Vec_IntArray(vSupp), Vec_IntLimit(vSupp), 0, 0, 0, 0 );
            if ( status != l_False )
                printf( "Failed internal check at node %d.\n", Pivot );
            assert( status == l_False );
            nSuppNew = sat_solver_minimize_assumptions( pSat, Vec_IntArray(vSupp), Vec_IntSize(vSupp), 0 );
            Vec_IntShrink( vSupp, nSuppNew );
            Vec_IntLits2Vars( vSupp, -6*nVars );
            Vec_IntSort( vSupp, 1 );
            // count how many belong to H; the rest belong to G
            NodeMark = 0;
            Vec_IntForEachEntry( vSupp, iFanin3, k3 )
                if ( iFanin3 >= nDivs )
                    Vec_IntWriteEntry( vSupp, k3, iFanin3 - nDivs );
                else 
                    NodeMark++;
            if ( NodeMark == 0 )
            {
                //printf( "Obj %d: Special case 2 (vars = %d)\n", Pivot, Vec_IntSize(vSupp) );
                continue;
            }
            assert( NodeMark > 0 );
            if ( Vec_IntSize(vSupp) - NodeMark <= nLutSize )
                return NodeMark;
        }
    }

    return 0;
}